

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O3

void __thiscall avro::BinaryEncoder::encodeString(BinaryEncoder *this,string *s)

{
  size_t n;
  array<unsigned_char,_10UL> bytes;
  array<unsigned_char,_10UL> local_22;
  
  n = encodeInt64(s->_M_string_length,&local_22);
  StreamWriter::writeBytes(&this->out_,local_22.elems,n);
  StreamWriter::writeBytes(&this->out_,(uint8_t *)(s->_M_dataplus)._M_p,s->_M_string_length);
  return;
}

Assistant:

void BinaryEncoder::encodeString(const std::string& s)
{
    doEncodeLong(s.size());
    out_.writeBytes(reinterpret_cast<const uint8_t*>(s.c_str()), s.size());
}